

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  FILE *__stream;
  ostream *poVar2;
  string *pathname;
  FilePath output_dir;
  FilePath output_file;
  string local_1c8;
  stringstream stream;
  ostream local_198 [376];
  
  pathname = &this->output_file_;
  FilePath::FilePath(&output_file,pathname);
  FilePath::RemoveFileName(&output_dir,&output_file);
  bVar1 = FilePath::CreateDirectoriesRecursively(&output_dir);
  if (bVar1) {
    __stream = fopen((pathname->_M_dataplus)._M_p,"w");
    if (__stream != (FILE *)0x0) goto LAB_0021580b;
  }
  GTestLog::GTestLog((GTestLog *)&stream,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest.cc"
                     ,0xdaa);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Unable to open file \"");
  poVar2 = std::operator<<(poVar2,(string *)pathname);
  std::operator<<(poVar2,"\"");
  GTestLog::~GTestLog((GTestLog *)&stream);
  __stream = (FILE *)0x0;
LAB_0021580b:
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  PrintXmlUnitTest(local_198,unit_test);
  StringStreamToString(&local_1c8,&stream);
  fputs(local_1c8._M_dataplus._M_p,__stream);
  std::__cxx11::string::_M_dispose();
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.

    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file_ << "\"";
  }
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}